

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O0

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep)

{
  char *in_RDI;
  char *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (char *)0x0) {
    local_8 = "Deleting";
  }
  if (yydebug != 0) {
    fprintf(_stderr,"%s ",local_8);
    yy_symbol_print((FILE *)yymsg,yykind,yyvaluep);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep)
{
  YY_USE (yyvaluep);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}